

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTextureImageName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int textureTarget,int mipLevel
          ,int imageIndex)

{
  string *psVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  ostringstream result;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Level",5);
  std::ostream::operator<<(local_1a0,textureTarget);
  lVar2 = 5;
  iVar4 = (int)this;
  if (iVar4 == 0x806f) {
    pcVar3 = "Slice";
  }
  else if (iVar4 == 0x8513) {
    lVar2 = 4;
    pcVar3 = "Face";
  }
  else {
    if (iVar4 != 0x8c1a) goto LAB_006325d2;
    pcVar3 = "Layer";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar3,lVar2);
  std::ostream::operator<<(local_1a0,mipLevel);
LAB_006325d2:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  psVar1 = (string *)std::ios_base::~ios_base(local_130);
  return psVar1;
}

Assistant:

string getTextureImageName (int textureTarget, int mipLevel, int imageIndex)
{
	std::ostringstream result;
	result << "Level";
	result << mipLevel;
	switch (textureTarget)
	{
		case GL_TEXTURE_2D:			break;
		case GL_TEXTURE_3D:			result << "Slice" << imageIndex; break;
		case GL_TEXTURE_CUBE_MAP:	result << "Face" << imageIndex; break;
		case GL_TEXTURE_2D_ARRAY:	result << "Layer" << imageIndex; break;
		default:
			DE_FATAL("Unsupported texture target");
			break;
	}
	return result.str();
}